

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O1

bool __thiscall
BlurayHelper::createMPLSFile
          (BlurayHelper *this,TSMuxer *mainMuxer,TSMuxer *subMuxer,int autoChapterLen,
          vector<double,_std::allocator<double>_> *customChapters,DiskType dt,int mplsOffset,
          bool isMvcBaseViewR)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_color _Var3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  pointer pcVar7;
  _func_int *p_Var8;
  void *pvVar9;
  uint8_t *puVar10;
  BlurayHelper *pBVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  MPLSStreamInfo *pMVar17;
  _Base_ptr p_Var18;
  File *this_00;
  undefined8 *puVar19;
  long *plVar20;
  ulong *puVar21;
  size_type *psVar22;
  PMTStreamInfo *stream;
  PMTStreamInfo *pPVar23;
  PMTStreamInfo *pPVar24;
  char *pcVar25;
  undefined8 uVar26;
  ulong uVar27;
  PMTStreamInfo *stream_1;
  _Rb_tree_header *p_Var28;
  const_iterator __begin2;
  double *pdVar29;
  _Base_ptr p_Var30;
  bool bVar31;
  string dstDir;
  PIDListMap pidListMVC;
  PIDListMap pidList;
  MPLSParser mplsParser;
  string prefix;
  ulong *local_300;
  ulong local_2f8;
  ulong local_2f0;
  undefined8 uStack_2e8;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  long *local_2a0;
  ulong local_298;
  long local_290;
  undefined8 uStack_288;
  ulong *local_280;
  ulong local_278;
  ulong local_270 [2];
  string local_260;
  pointer local_240;
  DiskType local_234;
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  uint8_t *local_1f0;
  TSMuxer *local_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  BlurayHelper *local_1c0;
  undefined **local_1b8;
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  local_1b0;
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  local_180;
  undefined1 local_150 [56];
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> local_118;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> local_100;
  pointer local_e8 [2];
  pointer local_d8;
  int local_d0;
  bool bStack_cc;
  bool bStack_cb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_a0 [64];
  uint8_t local_60;
  
  local_234 = dt;
  local_1e8 = subMuxer;
  local_1c0 = this;
  TSMuxer::getFirstPts((vector<long,_std::allocator<long>_> *)local_150,mainMuxer);
  plVar20 = (long *)CONCAT44(local_150._4_4_,local_150._0_4_);
  lVar4 = *plVar20;
  operator_delete(plVar20,CONCAT44(local_150._20_4_,local_150._16_4_) - (long)plVar20);
  TSMuxer::getLastPts((vector<long,_std::allocator<long>_> *)local_150,mainMuxer);
  pvVar9 = (void *)CONCAT44(local_150._4_4_,local_150._0_4_);
  lVar5 = *(long *)(CONCAT17(local_150[0xf],
                             CONCAT16(local_150[0xe],CONCAT15(local_150[0xd],local_150._8_5_))) + -8
                   );
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,CONCAT44(local_150._20_4_,local_150._16_4_) - (long)pvVar9);
  }
  local_1f0 = (uint8_t *)operator_new__(0x19000);
  MPLSParser::MPLSParser((MPLSParser *)local_150);
  local_d0 = TSMuxer::getFirstFileNum(mainMuxer);
  local_150._0_4_ = 1;
  local_150[0xd] = '\0';
  local_150._24_4_ = (undefined4)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1);
  local_150._28_4_ = (undefined4)((ulong)(lVar5 - (lVar5 >> 0x3f)) >> 1);
  bStack_cb = isMvcBaseViewR;
  pdVar29 = (customChapters->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar6 = (customChapters->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar13 = autoChapterLen;
  if (pdVar29 != pdVar6) {
    do {
      uVar12 = (uint)(long)(*pdVar29 * 45000.0);
      if (uVar12 <= (uint)(local_150._28_4_ - local_150._24_4_)) {
        local_a0._0_4_ = -1;
        local_180._M_impl._0_4_ = local_150._24_4_ + uVar12;
        std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)local_e8,(int *)local_a0,
                   (uint *)&local_180);
      }
      pdVar29 = pdVar29 + 1;
      iVar13 = local_150._20_4_;
    } while (pdVar29 != pdVar6);
  }
  local_150._20_4_ = iVar13;
  local_150[0xe] = false;
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::_Rb_tree(&local_180,&(mainMuxer->m_pmt).pidList._M_t);
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b0._M_impl.super__Rb_tree_header._M_header;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_1e8 != (TSMuxer *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
    ::operator=(&local_1b0,&(local_1e8->m_pmt).pidList._M_t);
  }
  p_Var28 = &local_180._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_180._M_impl.super__Rb_tree_header._M_header._M_left != p_Var28) {
    local_1b8 = &PTR__PGSStreamReader_002421d8;
    p_Var18 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>>::emplace_back<PMTStreamInfo&>
                ((vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>> *)&local_118,
                 (PMTStreamInfo *)&p_Var18[1]._M_parent);
      p_Var30 = p_Var18[6]._M_right;
      if ((p_Var30 == (_Base_ptr)0x0) || (*(undefined ***)p_Var30 != local_1b8)) {
        p_Var30 = (_Base_ptr)0x0;
      }
      if (p_Var30 != (_Base_ptr)0x0) {
        local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].offsetId =
             *(uint8_t *)((long)&p_Var30[0xe]._M_right + 6);
        local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].SS_PG_offset_sequence_id =
             *(int *)&p_Var30[3].field_0x4;
        bVar31 = *(bool *)&p_Var30[2]._M_right;
        local_240 = local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].isSSPG = bVar31;
        if (bVar31 == true) {
          iVar13 = *(int *)((long)&p_Var30[2]._M_right + 4);
          p_Var16 = local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var15 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
          while (local_1b0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var16,
                (_Rb_tree_header *)p_Var15 != p_Var28) {
            pPVar23 = (PMTStreamInfo *)&p_Var15[1]._M_parent;
            if (*(int *)&p_Var15[6]._M_right[1]._M_left == iVar13) goto LAB_0017acb8;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
            p_Var16 = local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          pPVar23 = (PMTStreamInfo *)0x0;
LAB_0017acb8:
          pPVar24 = pPVar23;
          if (pPVar23 == (PMTStreamInfo *)0x0) {
            if ((_Rb_tree_header *)p_Var16 != &local_1b0._M_impl.super__Rb_tree_header) {
              do {
                pPVar24 = (PMTStreamInfo *)&p_Var16[1]._M_parent;
                if (*(int *)&p_Var16[6]._M_right[1]._M_left == iVar13) goto LAB_0017ad04;
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
              } while ((_Rb_tree_header *)p_Var16 != &local_1b0._M_impl.super__Rb_tree_header);
            }
            pPVar24 = (PMTStreamInfo *)0x0;
          }
LAB_0017ad04:
          if (pPVar24 != (PMTStreamInfo *)0x0) {
            pMVar17 = (MPLSStreamInfo *)operator_new(0x70);
            MPLSStreamInfo::MPLSStreamInfo(pMVar17,pPVar24);
            local_240[-1].leftEye = pMVar17;
            if (pPVar23 == (PMTStreamInfo *)0x0) {
              pMVar17->type = '\x02';
            }
          }
          _Var3 = p_Var30[3]._M_color;
          p_Var16 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((_Rb_tree_header *)local_180._M_impl.super__Rb_tree_header._M_header._M_left ==
              p_Var28) {
            pPVar23 = (PMTStreamInfo *)0x0;
          }
          else {
            do {
              pPVar23 = (PMTStreamInfo *)&p_Var16[1]._M_parent;
              if (*(_Rb_tree_color *)&p_Var16[6]._M_right[1]._M_left == _Var3) goto LAB_0017ad83;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            } while ((_Rb_tree_header *)p_Var16 != p_Var28);
            pPVar23 = (PMTStreamInfo *)0x0;
          }
LAB_0017ad83:
          pPVar24 = pPVar23;
          p_Var16 = local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
          if (pPVar23 == (PMTStreamInfo *)0x0) {
            for (; (_Rb_tree_header *)p_Var16 != &local_1b0._M_impl.super__Rb_tree_header;
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
              pPVar24 = (PMTStreamInfo *)&p_Var16[1]._M_parent;
              if (*(_Rb_tree_color *)&p_Var16[6]._M_right[1]._M_left == _Var3) goto LAB_0017adbe;
            }
            pPVar24 = (PMTStreamInfo *)0x0;
          }
LAB_0017adbe:
          if (pPVar24 != (PMTStreamInfo *)0x0) {
            pMVar17 = (MPLSStreamInfo *)operator_new(0x70);
            MPLSStreamInfo::MPLSStreamInfo(pMVar17,pPVar24);
            local_240[-1].rightEye = pMVar17;
            if (pPVar23 == (PMTStreamInfo *)0x0) {
              pMVar17->type = '\x02';
            }
          }
        }
      }
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while ((_Rb_tree_header *)p_Var18 != p_Var28);
  }
  p_Var28 = &local_1b0._M_impl.super__Rb_tree_header;
  if ((local_1e8 != (TSMuxer *)0x0) &&
     (bStack_cc = true,
     (_Rb_tree_header *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var28)) {
    p_Var18 = local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      MPLSStreamInfo::MPLSStreamInfo
                ((MPLSStreamInfo *)local_a0,(PMTStreamInfo *)&p_Var18[1]._M_parent);
      local_60 = '\x02';
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                (&local_100,(MPLSStreamInfo *)local_a0);
      MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_a0);
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while ((_Rb_tree_header *)p_Var18 != p_Var28);
  }
  pcVar25 = "Creating AVCHD playlist";
  if (local_234 == BLURAY) {
    pcVar25 = "Creating Blu-ray playlist";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar25,(ulong)(local_234 == BLURAY) * 2 + 0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  puVar10 = local_1f0;
  sLastMsg = true;
  iVar13 = MPLSParser::compose((MPLSParser *)local_150,local_1f0,0x19000,local_234);
  pBVar11 = local_1c0;
  if (local_1c0->m_isoWriter == (IsoWriter *)0x0) {
    local_a0._0_8_ = local_a0 + 0x10;
    pcVar7 = (local_1c0->m_dstPath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar7,pcVar7 + (local_1c0->m_dstPath)._M_string_length);
  }
  else {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  }
  local_240 = (pointer)CONCAT44(local_240._4_4_,iVar13);
  if (pBVar11->m_isoWriter == (IsoWriter *)0x0) {
    this_00 = (File *)operator_new(0x38);
    File::File(this_00);
  }
  else {
    this_00 = (File *)IsoWriter::createFile(pBVar11->m_isoWriter);
  }
  paVar1 = &local_2c0.field_2;
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"BDMV","");
  getDirSeparator();
  puVar19 = (undefined8 *)
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_2c0,local_2c0._M_string_length,0,'\x01');
  puVar21 = puVar19 + 2;
  if ((ulong *)*puVar19 == puVar21) {
    local_2f0 = *puVar21;
    uStack_2e8 = puVar19[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar21;
    local_300 = (ulong *)*puVar19;
  }
  local_2f8 = puVar19[1];
  *puVar19 = puVar21;
  puVar19[1] = 0;
  *(undefined1 *)(puVar19 + 2) = 0;
  paVar2 = &local_2e0.field_2;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"PLAYLIST","");
  uVar27 = 0xf;
  if (local_300 != &local_2f0) {
    uVar27 = local_2f0;
  }
  if (uVar27 < local_2e0._M_string_length + local_2f8) {
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar2) {
      uVar26 = local_2e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_2e0._M_string_length + local_2f8) goto LAB_0017b066;
    puVar19 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0017b066:
    puVar19 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2e0._M_dataplus._M_p);
  }
  local_2a0 = &local_290;
  plVar20 = puVar19 + 2;
  if ((long *)*puVar19 == plVar20) {
    local_290 = *plVar20;
    uStack_288 = puVar19[3];
  }
  else {
    local_290 = *plVar20;
    local_2a0 = (long *)*puVar19;
  }
  local_298 = puVar19[1];
  *puVar19 = plVar20;
  puVar19[1] = 0;
  *(undefined1 *)plVar20 = 0;
  getDirSeparator();
  plVar20 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_2a0,local_298,0,'\x01');
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar22 = (size_type *)(plVar20 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar20 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_210.field_2._M_allocated_capacity = *psVar22;
    local_210.field_2._8_8_ = plVar20[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar22;
    local_210._M_dataplus._M_p = (pointer)*plVar20;
  }
  local_210._M_string_length = plVar20[1];
  *plVar20 = (long)psVar22;
  plVar20[1] = 0;
  *(undefined1 *)(plVar20 + 2) = 0;
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_210);
  int32ToStr_abi_cxx11_(&local_260,&mplsOffset);
  strPadLeft(&local_2e0,&local_260,5,'0');
  uVar26 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    uVar26 = local_2c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar26 < local_2e0._M_string_length + local_2c0._M_string_length) {
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar2) {
      uVar26 = local_2e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_2e0._M_string_length + local_2c0._M_string_length) goto LAB_0017b227;
    puVar19 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
  }
  else {
LAB_0017b227:
    puVar19 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2e0._M_dataplus._M_p);
  }
  puVar21 = puVar19 + 2;
  if ((ulong *)*puVar19 == puVar21) {
    local_2f0 = *puVar21;
    uStack_2e8 = puVar19[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar21;
    local_300 = (ulong *)*puVar19;
  }
  local_2f8 = puVar19[1];
  *puVar19 = puVar21;
  puVar19[1] = 0;
  *(undefined1 *)puVar21 = 0;
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,".mpls","");
  uVar27 = 0xf;
  if (local_300 != &local_2f0) {
    uVar27 = local_2f0;
  }
  if (uVar27 < local_278 + local_2f8) {
    uVar27 = 0xf;
    if (local_280 != local_270) {
      uVar27 = local_270[0];
    }
    if (uVar27 < local_278 + local_2f8) goto LAB_0017b2fa;
    puVar19 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0017b2fa:
    puVar19 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_280);
  }
  plVar20 = puVar19 + 2;
  if ((long *)*puVar19 == plVar20) {
    local_290 = *plVar20;
    uStack_288 = puVar19[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *plVar20;
    local_2a0 = (long *)*puVar19;
  }
  local_298 = puVar19[1];
  *puVar19 = plVar20;
  puVar19[1] = 0;
  *(undefined1 *)plVar20 = 0;
  iVar13 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                     (this_00,local_2a0,2,0);
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((char)iVar13 != '\0') {
    iVar13 = (int)local_240;
    iVar14 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                       (this_00,puVar10,(ulong)local_240 & 0xffffffff);
    p_Var8 = (this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3];
    if (iVar14 == iVar13) {
      (*p_Var8)(this_00);
      local_280 = local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"BDMV","");
      getDirSeparator();
      plVar20 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_280,local_278,0,'\x01');
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      puVar21 = (ulong *)(plVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_260.field_2._M_allocated_capacity = *puVar21;
        local_260.field_2._8_8_ = plVar20[3];
      }
      else {
        local_260.field_2._M_allocated_capacity = *puVar21;
        local_260._M_dataplus._M_p = (pointer)*plVar20;
      }
      local_260._M_string_length = plVar20[1];
      *plVar20 = (long)puVar21;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      local_230 = local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"BACKUP","");
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        uVar26 = local_260.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_228 + local_260._M_string_length) {
        uVar27 = 0xf;
        if (local_230 != local_220) {
          uVar27 = local_220[0];
        }
        if (uVar27 < local_228 + local_260._M_string_length) goto LAB_0017b594;
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_230,0,(char *)0x0,(ulong)local_260._M_dataplus._M_p);
      }
      else {
LAB_0017b594:
        puVar19 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_230)
        ;
      }
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      puVar21 = puVar19 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_2e0.field_2._M_allocated_capacity = *puVar21;
        local_2e0.field_2._8_8_ = puVar19[3];
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *puVar21;
        local_2e0._M_dataplus._M_p = (pointer)*puVar19;
      }
      local_2e0._M_string_length = puVar19[1];
      *puVar19 = puVar21;
      puVar19[1] = 0;
      *(undefined1 *)puVar21 = 0;
      getDirSeparator();
      plVar20 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_2e0,local_2e0._M_string_length,0,'\x01');
      puVar21 = (ulong *)(plVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_2c0.field_2._M_allocated_capacity = *puVar21;
        local_2c0.field_2._8_8_ = plVar20[3];
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      }
      else {
        local_2c0.field_2._M_allocated_capacity = *puVar21;
        local_2c0._M_dataplus._M_p = (pointer)*plVar20;
      }
      local_2c0._M_string_length = plVar20[1];
      *plVar20 = (long)puVar21;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      local_1e0 = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"PLAYLIST","");
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar26 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_1d8 + local_2c0._M_string_length) {
        uVar27 = 0xf;
        if (local_1e0 != local_1d0) {
          uVar27 = local_1d0[0];
        }
        if (uVar27 < local_1d8 + local_2c0._M_string_length) goto LAB_0017b6da;
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
      }
      else {
LAB_0017b6da:
        puVar19 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_1e0)
        ;
      }
      puVar21 = puVar19 + 2;
      if ((ulong *)*puVar19 == puVar21) {
        local_2f0 = *puVar21;
        uStack_2e8 = puVar19[3];
        local_300 = &local_2f0;
      }
      else {
        local_2f0 = *puVar21;
        local_300 = (ulong *)*puVar19;
      }
      local_2f8 = puVar19[1];
      *puVar19 = puVar21;
      puVar19[1] = 0;
      *(undefined1 *)puVar21 = 0;
      getDirSeparator();
      puVar19 = (undefined8 *)
                std::__cxx11::string::_M_replace_aux((ulong)&local_300,local_2f8,0,'\x01');
      plVar20 = puVar19 + 2;
      if ((long *)*puVar19 == plVar20) {
        local_290 = *plVar20;
        uStack_288 = puVar19[3];
        local_2a0 = &local_290;
      }
      else {
        local_290 = *plVar20;
        local_2a0 = (long *)*puVar19;
      }
      local_298 = puVar19[1];
      *puVar19 = plVar20;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_210,(string *)&local_2a0);
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      puVar10 = local_1f0;
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if (local_230 != local_220) {
        operator_delete(local_230,local_220[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      std::operator+(&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_210);
      int32ToStr_abi_cxx11_(&local_260,&mplsOffset);
      strPadLeft(&local_2e0,&local_260,5,'0');
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar26 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_2e0._M_string_length + local_2c0._M_string_length) {
        uVar26 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          uVar26 = local_2e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar26 < local_2e0._M_string_length + local_2c0._M_string_length)
        goto LAB_0017b939;
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
      }
      else {
LAB_0017b939:
        puVar19 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2c0,(ulong)local_2e0._M_dataplus._M_p);
      }
      puVar21 = puVar19 + 2;
      if ((ulong *)*puVar19 == puVar21) {
        local_2f0 = *puVar21;
        uStack_2e8 = puVar19[3];
        local_300 = &local_2f0;
      }
      else {
        local_2f0 = *puVar21;
        local_300 = (ulong *)*puVar19;
      }
      local_2f8 = puVar19[1];
      *puVar19 = puVar21;
      puVar19[1] = 0;
      *(undefined1 *)puVar21 = 0;
      local_280 = local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,".mpls","");
      uVar27 = 0xf;
      if (local_300 != &local_2f0) {
        uVar27 = local_2f0;
      }
      if (uVar27 < local_278 + local_2f8) {
        uVar27 = 0xf;
        if (local_280 != local_270) {
          uVar27 = local_270[0];
        }
        if (uVar27 < local_278 + local_2f8) goto LAB_0017ba02;
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_300);
      }
      else {
LAB_0017ba02:
        puVar19 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_280)
        ;
      }
      plVar20 = puVar19 + 2;
      if ((long *)*puVar19 == plVar20) {
        local_290 = *plVar20;
        uStack_288 = puVar19[3];
        local_2a0 = &local_290;
      }
      else {
        local_290 = *plVar20;
        local_2a0 = (long *)*puVar19;
      }
      local_298 = puVar19[1];
      *puVar19 = plVar20;
      puVar19[1] = 0;
      *(undefined1 *)plVar20 = 0;
      iVar13 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                         (this_00,local_2a0,2,0);
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((char)iVar13 == '\0') {
        bVar31 = false;
      }
      else {
        iVar13 = (int)local_240;
        iVar14 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream
                   [5])(this_00,puVar10,(ulong)local_240 & 0xffffffff);
        bVar31 = iVar14 == iVar13;
        (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])
                  (this_00);
      }
      operator_delete__(puVar10);
      goto LAB_0017bb63;
    }
    (*p_Var8)(this_00);
  }
  operator_delete__(puVar10);
  bVar31 = false;
LAB_0017bb63:
  (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[1])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&local_1b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_e8[0] != (pointer)0x0) {
    operator_delete(local_e8[0],(long)local_d8 - (long)local_e8[0]);
  }
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&local_100);
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&local_118);
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector
            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)(local_150 + 0x20));
  return bVar31;
}

Assistant:

bool BlurayHelper::createMPLSFile(TSMuxer* mainMuxer, TSMuxer* subMuxer, int autoChapterLen,
                                  const vector<double>& customChapters, DiskType dt, int mplsOffset,
                                  bool isMvcBaseViewR) const
{
    int64_t firstPts = *(mainMuxer->getFirstPts().begin());
    int64_t lastPts = *(mainMuxer->getLastPts().rbegin());

    int bufSize = 1024 * 100;
    auto mplsBuffer = new uint8_t[bufSize];
    MPLSParser mplsParser;
    mplsParser.m_m2tsOffset = mainMuxer->getFirstFileNum();
    mplsParser.PlayList_playback_type = 1;
    mplsParser.ref_to_STC_id = 0;
    mplsParser.IN_time = static_cast<uint32_t>(firstPts / 2);
    mplsParser.OUT_time = static_cast<uint32_t>(lastPts / 2);
    mplsParser.mvc_base_view_r = isMvcBaseViewR;

    if (customChapters.empty())
    {
        mplsParser.m_chapterLen = autoChapterLen;
    }
    else
    {
        for (auto& i : customChapters)
        {
            auto mark = static_cast<uint32_t>(i * 45000.0);
            if (mark <= (mplsParser.OUT_time - mplsParser.IN_time))
                mplsParser.m_marks.emplace_back(-1, mark + mplsParser.IN_time);
        }
    }
    mplsParser.PlayItem_random_access_flag = false;
    PIDListMap pidList = mainMuxer->getPidList();
    PIDListMap pidListMVC;
    if (subMuxer)
        pidListMVC = subMuxer->getPidList();

    for (auto& [index, si] : pidList)
    {
        mplsParser.m_streamInfo.emplace_back(si);
        MPLSStreamInfo& info = *mplsParser.m_streamInfo.rbegin();
        auto pgStream = dynamic_cast<PGSStreamReader*>(si.m_codecReader);
        if (pgStream)
        {
            info.offsetId = pgStream->getOffsetId();
            info.SS_PG_offset_sequence_id = pgStream->ssPGOffset;
            info.isSSPG = pgStream->isSSPG;
            if (info.isSSPG)
            {
                bool isSecondary = false;
                const PMTStreamInfo* left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidList);
                if (!left)
                {
                    left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (left)
                {
                    info.leftEye = new MPLSStreamInfo(*left);
                    if (isSecondary)
                        info.leftEye->type = 2;  // ref to subclip
                }

                isSecondary = false;
                const PMTStreamInfo* right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidList);
                if (!right)
                {
                    right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (right)
                {
                    info.rightEye = new MPLSStreamInfo(*right);
                    if (isSecondary)
                        info.rightEye->type = 2;  // ref to subclip
                }
            }
        }
    }
    if (subMuxer)
    {
        mplsParser.isDependStreamExist = true;
        for (const auto& [pid, si] : pidListMVC)
        {
            MPLSStreamInfo data(si);
            data.type = 2;  // Identify an elementary stream of the Clip used by a SubPath with SubPath_type set to
                            // 2,3,4,5,6,8 or 9
            mplsParser.m_streamInfoMVC.push_back(data);
        }
    }

    if (dt == DiskType::BLURAY)
    {
        LTRACE(LT_INFO, 2, "Creating Blu-ray playlist");
    }
    else
    {
        LTRACE(LT_INFO, 2, "Creating AVCHD playlist");
    }
    int fileLen = mplsParser.compose(mplsBuffer, bufSize, dt);

    string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    string dstDir = string("BDMV") + getDirSeparator() + string("PLAYLIST") + getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();

    dstDir = string("BDMV") + getDirSeparator() + string("BACKUP") + getDirSeparator() + string("PLAYLIST") +
             getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();
    delete[] mplsBuffer;
    delete file;
    return true;
}